

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmop.cpp
# Opt level: O0

size_t CVmOpcodes::get_op_size(uchar *op)

{
  byte bVar1;
  int iVar2;
  byte *in_RDI;
  ulong local_8;
  
  bVar1 = *in_RDI;
  if (bVar1 == 0xc) {
    iVar2 = ::osrp2(in_RDI + 1);
    local_8 = (ulong)(iVar2 + 3);
  }
  else if (bVar1 == 0x57) {
    iVar2 = ::osrp2(in_RDI + 1);
    local_8 = (ulong)(iVar2 + 3);
  }
  else if (bVar1 == 0x90) {
    iVar2 = ::osrp2(in_RDI + 1);
    local_8 = (long)iVar2 * 7 + 5;
  }
  else {
    local_8 = (ulong)""[*in_RDI];
  }
  return local_8;
}

Assistant:

size_t CVmOpcodes::get_op_size(const uchar *op)
{
    switch (*op)
    {
    case OPC_PUSHSTRI:
        return 3 + osrp2(op+1);
        
    case OPC_SWITCH:
        return 1 + 2 + (VMB_DATAHOLDER + 2)*osrp2(op+1) + 2;
        
    case OPC_NAMEDARGTAB:
        return 1 + 2 + osrp2(op+1);

    default:
        /* all others have fixed sizes */
        return op_siz[*op];
    }
}